

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license-generator.cpp
# Opt level: O0

string * license::LicenseGenerator::normalize_date(string *__return_storage_ptr__,string *sDate)

{
  bool bVar1;
  _Setfill<char> _Var2;
  int iVar3;
  _Setw _Var4;
  ulong uVar5;
  invalid_argument *piVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ostream *poVar9;
  ostringstream local_1c0 [8];
  ostringstream oss;
  ulong uStack_40;
  int chread;
  size_t i;
  uint local_30;
  uint uStack_2c;
  bool found;
  uint day;
  uint month;
  uint year;
  string *local_18;
  string *sDate_local;
  
  local_18 = sDate;
  sDate_local = __return_storage_ptr__;
  uVar5 = std::__cxx11::string::size();
  if (uVar5 < 8) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Date string too small for known formats");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar1 = false;
  uStack_40 = 0;
  do {
    if (2 < uStack_40) {
LAB_002f89f7:
      if (!bVar1) {
        piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar6,"Date string did not match a known format");
        __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      std::__cxx11::ostringstream::ostringstream(local_1c0);
      poVar9 = (ostream *)std::ostream::operator<<(local_1c0,day);
      poVar9 = std::operator<<(poVar9,"-");
      _Var2 = std::setfill<char>('0');
      poVar9 = std::operator<<(poVar9,_Var2._M_c);
      _Var4 = std::setw(2);
      poVar9 = std::operator<<(poVar9,_Var4);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,uStack_2c);
      poVar9 = std::operator<<(poVar9,"-");
      _Var2 = std::setfill<char>('0');
      poVar9 = std::operator<<(poVar9,_Var2._M_c);
      _Var4 = std::setw(2);
      poVar9 = std::operator<<(poVar9,_Var4);
      std::ostream::operator<<(poVar9,local_30);
      std::__cxx11::ostringstream::str();
      std::__cxx11::ostringstream::~ostringstream(local_1c0);
      return __return_storage_ptr__;
    }
    uVar7 = std::__cxx11::string::c_str();
    uVar8 = std::__cxx11::string::c_str();
    iVar3 = __isoc99_sscanf(uVar7,uVar8,&day,&stack0xffffffffffffffd4,&local_30);
    if (iVar3 == 3) {
      bVar1 = true;
      goto LAB_002f89f7;
    }
    uStack_40 = uStack_40 + 1;
  } while( true );
}

Assistant:

string LicenseGenerator::normalize_date(const std::string& sDate) {
	if(sDate.size()<8)
		throw invalid_argument("Date string too small for known formats");
	unsigned int year, month, day;
	bool found = false;
	for (size_t i = 0; i < formats_n && !found; ++i) {
		const int chread = sscanf(sDate.c_str(),formats[i].c_str(),&year,&month,&day);
		if(chread==3) {
			found = true;
			break;
		}
	}
	if(!found)
		throw invalid_argument("Date string did not match a known format");
	ostringstream oss;
	oss << year << "-" << setfill('0') << std::setw(2) << month << "-" << setfill('0') << std::setw(2) << day;
	return oss.str();
}